

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

char * String::findLast(char *in,char *str)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar1 = strstr(in,str);
  if (pcVar1 == (char *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    do {
      pcVar2 = pcVar1;
      pcVar1 = strstr(pcVar2 + 1,str);
    } while (pcVar1 != (char *)0x0);
  }
  return pcVar2;
}

Assistant:

const char* String::findLast(const char* in, const char* str)
{
  const char* result = 0;
  const char* match = strstr(in, str);
  for(;;)
  {
    if(!match)
      return result;
    result = match;
    match = strstr(match + 1, str);
  }
}